

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

string * __thiscall
testing::internal::FormatCxxExceptionMessage_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,char *description,char *location)

{
  ostream *poVar1;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RAX;
  size_t sVar2;
  string *psVar3;
  long lVar4;
  char *pcVar5;
  Message local_38;
  Message message;
  
  local_38.ss_.ptr_ =
       (scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        )(scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )in_RAX.ptr_;
  Message::Message(&local_38);
  poVar1 = (ostream *)((long)local_38.ss_.ptr_ + 0x10);
  if (this == (internal *)0x0) {
    lVar4 = 0x15;
    pcVar5 = "Unknown C++ exception";
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"C++ exception with description \"",0x20);
    sVar2 = strlen((char *)this);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)this,sVar2);
    lVar4 = 1;
    pcVar5 = "\"";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar5,lVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," thrown in ",0xb);
  if (description == (char *)0x0) {
    sVar2 = 6;
    description = "(null)";
  }
  else {
    sVar2 = strlen(description);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,description,sVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,".",1);
  psVar3 = StringStreamToString(__return_storage_ptr__,(stringstream *)local_38.ss_.ptr_);
  if (local_38.ss_.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    psVar3 = (string *)(**(code **)(*(long *)local_38.ss_.ptr_ + 8))(local_38.ss_.ptr_);
    return psVar3;
  }
  return psVar3;
}

Assistant:

static std::string FormatCxxExceptionMessage(const char* description,
                                             const char* location) {
  Message message;
  if (description != NULL) {
    message << "C++ exception with description \"" << description << "\"";
  } else {
    message << "Unknown C++ exception";
  }
  message << " thrown in " << location << ".";

  return message.GetString();
}